

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

int __thiscall mpt::config::root::assign(root *this,path *dest,value *val)

{
  undefined8 *puVar1;
  int iVar2;
  metatype *pmVar3;
  long lVar4;
  path p;
  
  iVar2 = -1;
  if ((dest != (path *)0x0) && (dest->len != 0)) {
    path::path(&p,dest);
    if (val == (value *)0x0) {
      lVar4 = mpt_config_item_query(&this->_sub,&p);
      iVar2 = 0;
      if ((lVar4 != 0) &&
         (puVar1 = *(undefined8 **)(lVar4 + 8), iVar2 = 0, puVar1 != (undefined8 *)0x0)) {
        iVar2 = (**(code **)*puVar1)(puVar1,0,0);
        if (*(long **)(lVar4 + 8) != (long *)0x0) {
          (**(code **)(**(long **)(lVar4 + 8) + 8))();
        }
        *(undefined8 *)(lVar4 + 8) = 0;
      }
    }
    else {
      pmVar3 = metatype::create(val);
      if (pmVar3 == (metatype *)0x0) {
        iVar2 = -3;
      }
      else {
        lVar4 = mpt_config_item_reserve(&this->_sub,&p);
        if (lVar4 == 0) {
          (*(pmVar3->super_convertable)._vptr_convertable[1])(pmVar3);
          iVar2 = -4;
        }
        else {
          if (*(long **)(lVar4 + 8) != (long *)0x0) {
            (**(code **)(**(long **)(lVar4 + 8) + 8))();
          }
          *(metatype **)(lVar4 + 8) = pmVar3;
          iVar2 = (**(pmVar3->super_convertable)._vptr_convertable)(pmVar3,0,0);
        }
      }
    }
    path::~path(&p);
  }
  return iVar2;
}

Assistant:

int config::root::assign(const path *dest, const value *val)
{
	// no 'self' or 'root' element(s)
	if (!dest || dest->empty()) {
		return BadArgument;
	}
	// find existing
	path p = *dest;
	metatype *m;
	config_item *curr;
	
	if (!val) {
		if (!(curr = mpt_config_item_query(&_sub, &p))) {
			return 0;
		}
		int type = 0;
		if ((m = curr->instance())) {
			type = m->type();
			curr->set_instance(0);
		}
		return type;
	}
	if (!(m = metatype::create(*val))) {
		return BadType;
	}
	if (!(curr = mpt_config_item_reserve(&_sub, &p))) {
		m->unref();
		return BadOperation;
	}
	curr->set_instance(m);
	return m->type();
}